

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-pile.c
# Opt level: O3

void object_origin_combine(object *obj1,object *obj2)

{
  monster_race *pmVar1;
  _Bool _Var2;
  _Bool _Var3;
  monster_race *pmVar4;
  
  pmVar1 = obj1->origin_race;
  pmVar4 = obj2->origin_race;
  if (pmVar1 == pmVar4) {
    if ((obj1->origin == obj2->origin) && (obj1->origin_depth == obj2->origin_depth)) {
      return;
    }
  }
  else {
    if (pmVar1 == (monster_race *)0x0) {
      _Var2 = false;
    }
    else {
      _Var2 = flag_has_dbg(pmVar1->flags,0xb,1,"obj1->origin_race->flags","RF_UNIQUE");
      pmVar4 = obj2->origin_race;
    }
    if (pmVar4 == (monster_race *)0x0) {
      _Var3 = false;
    }
    else {
      _Var3 = flag_has_dbg(pmVar4->flags,0xb,1,"obj2->origin_race->flags","RF_UNIQUE");
    }
    if ((_Var2 != false) && (_Var3 == false)) {
      return;
    }
    if ((~_Var3 & 1U) == 0 && _Var2 == false) {
      obj1->origin = obj2->origin;
      obj1->origin_depth = obj2->origin_depth;
      obj1->origin_race = obj2->origin_race;
      return;
    }
  }
  obj1->origin = '\t';
  return;
}

Assistant:

void object_origin_combine(struct object *obj1, const struct object *obj2)
{
	if (obj1->origin_race != obj2->origin_race) {
		bool uniq1 = (obj1->origin_race
			&& rf_has(obj1->origin_race->flags, RF_UNIQUE));
		bool uniq2 = (obj2->origin_race
			&& rf_has(obj2->origin_race->flags, RF_UNIQUE));

		if (uniq1 && !uniq2) {
			/* Favour keeping record for a unique */
			;
		} else if (uniq2 && !uniq1) {
			/* Favour keeping record for a unique */
			obj1->origin = obj2->origin;
			obj1->origin_depth = obj2->origin_depth;
			obj1->origin_race = obj2->origin_race;
		} else {
			/* Different monsters, neither or both unique, mixed origin */
			obj1->origin = ORIGIN_MIXED;
		}
	} else if (obj1->origin != obj2->origin
			|| obj1->origin_depth != obj2->origin_depth) {
		obj1->origin = ORIGIN_MIXED;
	}
}